

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-maxpooling2d.cc
# Opt level: O0

Dim * __thiscall
dynet::MaxPooling2D::dim_forward
          (MaxPooling2D *this,vector<dynet::Dim,_std::allocator<dynet::Dim>_> *xs)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  invalid_argument *piVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  ulong uVar7;
  ulong *puVar8;
  long lVar9;
  reference pvVar10;
  vector<dynet::Dim,_std::allocator<dynet::Dim>_> *in_RDX;
  long in_RSI;
  Dim *in_RDI;
  double dVar11;
  float s_3;
  float kernel_dim;
  float input_dim;
  uint i;
  vector<long,_std::allocator<long>_> output_shape;
  uint bs;
  ostringstream s_2;
  ostringstream s_1;
  ostringstream s;
  vector<dynet::Dim,_std::allocator<dynet::Dim>_> *in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa50;
  float in_stack_fffffffffffffa54;
  size_type in_stack_fffffffffffffa58;
  vector<long,_std::allocator<long>_> *this_00;
  uint local_520;
  undefined1 local_519 [25];
  uint local_500;
  undefined1 local_4f9;
  string local_4f8 [32];
  ostringstream local_4d8 [252];
  uint in_stack_fffffffffffffc24;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffc28;
  Dim *in_stack_fffffffffffffc30;
  string local_358 [32];
  ostringstream local_338 [383];
  undefined1 local_1b9;
  string local_1b8 [48];
  ostringstream local_188 [376];
  vector<dynet::Dim,_std::allocator<dynet::Dim>_> *local_10;
  
  local_10 = in_RDX;
  sVar3 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::size(in_RDX);
  if (sVar3 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,"MaxPooling2D requires exactly one input: ");
    dynet::operator<<((ostream *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                      in_stack_fffffffffffffa48);
    local_1b9 = 1;
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(piVar4,local_1b8);
    local_1b9 = 0;
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar5 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](local_10,0);
  uVar2 = Dim::ndims(pvVar5);
  if (uVar2 != 3) {
    std::__cxx11::ostringstream::ostringstream(local_338);
    std::operator<<((ostream *)local_338,"Bad input dimensions in MaxPooling2D: ");
    dynet::operator<<((ostream *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                      in_stack_fffffffffffffa48);
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(piVar4,local_358);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((*(byte *)(in_RSI + 0x90) & 1) != 0) {
    pvVar5 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](local_10,0);
    uVar2 = pvVar5->d[0];
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x60),0);
    if (*pvVar6 <= uVar2) {
      pvVar5 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](local_10,0);
      uVar2 = pvVar5->d[1];
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x60),1);
      if (*pvVar6 <= uVar2) goto LAB_00cbbd6d;
    }
    std::__cxx11::ostringstream::ostringstream(local_4d8);
    std::operator<<((ostream *)local_4d8,
                    "Bad input dimensions in MaxPooling2D:         in VALID mode, the kernel size cannot be greater than the feature map size"
                   );
    dynet::operator<<((ostream *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                      in_stack_fffffffffffffa48);
    local_4f9 = 1;
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(piVar4,local_4f8);
    local_4f9 = 0;
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
LAB_00cbbd6d:
  pvVar5 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](local_10,0);
  local_500 = Dim::batch_elems(pvVar5);
  this_00 = (vector<long,_std::allocator<long>_> *)local_519;
  std::allocator<long>::allocator((allocator<long> *)0xcbbd9f);
  std::vector<long,_std::allocator<long>_>::vector
            (this_00,in_stack_fffffffffffffa58,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  std::allocator<long>::~allocator((allocator<long> *)0xcbbdc5);
  pvVar5 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](local_10,0);
  uVar7 = (ulong)pvVar5->d[2];
  puVar8 = (ulong *)std::vector<long,_std::allocator<long>_>::operator[]
                              ((vector<long,_std::allocator<long>_> *)(local_519 + 1),2);
  *puVar8 = uVar7;
  for (local_520 = 0; local_520 < 2; local_520 = local_520 + 1) {
    pvVar5 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](local_10,0);
    uVar2 = pvVar5->d[local_520];
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x60),
                        (ulong)local_520);
    uVar1 = *pvVar6;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x78),
                        (ulong)local_520);
    if ((*(byte *)(in_RSI + 0x90) & 1) == 0) {
      dVar11 = std::ceil((double)(ulong)(uint)((float)uVar2 / (float)*pvVar6));
      pvVar10 = std::vector<long,_std::allocator<long>_>::operator[]
                          ((vector<long,_std::allocator<long>_> *)(local_519 + 1),(ulong)local_520);
      *pvVar10 = (long)SUB84(dVar11,0);
    }
    else {
      dVar11 = std::ceil((double)(ulong)(uint)((((float)uVar2 - (float)uVar1) + 1.0) /
                                              (float)*pvVar6));
      in_stack_fffffffffffffa54 = SUB84(dVar11,0);
      lVar9 = (long)in_stack_fffffffffffffa54;
      pvVar10 = std::vector<long,_std::allocator<long>_>::operator[]
                          ((vector<long,_std::allocator<long>_> *)(local_519 + 1),(ulong)local_520);
      *pvVar10 = lVar9;
    }
  }
  Dim::Dim(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  return in_RDI;
}

Assistant:

Dim MaxPooling2D::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1) {
    ostringstream s; s << "MaxPooling2D requires exactly one input: " << xs;
    throw std::invalid_argument(s.str());
  }
  if (xs[0].ndims() != 3) {
    ostringstream s; s << "Bad input dimensions in MaxPooling2D: " << xs;
    throw std::invalid_argument(s.str());
  }
  if (is_valid && (xs[0].d[0] < ksize[0] || xs[0].d[1] < ksize[1])) {
    ostringstream s; s << "Bad input dimensions in MaxPooling2D: \
        in VALID mode, the kernel size cannot be greater than the feature map size" << xs;
    throw std::invalid_argument(s.str());
  }
  unsigned bs = xs[0].batch_elems();
  std::vector<long> output_shape(3);
  output_shape[2] = static_cast<long>(xs[0].d[2]);
  for (unsigned i = 0; i < 2; ++i) {
    float input_dim = static_cast<float>(xs[0].d[i]);
    float kernel_dim = static_cast<float>(ksize[i]);
    float s = static_cast<float>(stride[i]);
    if (is_valid) {
      output_shape[i] = static_cast<long>(ceil((input_dim - kernel_dim + 1) / s));
    } else {
      output_shape[i] = static_cast<long>(ceil(input_dim / s));
    }
  }
  return Dim(output_shape, bs);
}